

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

void __thiscall
google::
sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::erase(sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *this,iterator pos)

{
  bool bVar1;
  iterator local_50;
  
  end(&local_50,this);
  bVar1 = two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==(&pos.pos,&local_50.pos);
  if (!bVar1) {
    bVar1 = set_deleted(this,&pos);
    if (bVar1) {
      this->num_deleted = this->num_deleted + 1;
      (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
      consider_shrink_ = true;
    }
  }
  return;
}

Assistant:

void erase(iterator pos) {
    if (pos == end()) return;  // sanity check
    if (set_deleted(pos)) {    // true if object has been newly deleted
      ++num_deleted;
      // will think about shrink after next insert
      settings.set_consider_shrink(true);
    }
  }